

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

int stbi__jpeg_get_bit(stbi__jpeg *j)

{
  uint uVar1;
  uint k;
  stbi__jpeg *j_local;
  
  if (j->code_bits < 1) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < 1) {
    j_local._4_4_ = 0;
  }
  else {
    uVar1 = j->code_buffer;
    j->code_buffer = j->code_buffer << 1;
    j->code_bits = j->code_bits + -1;
    j_local._4_4_ = uVar1 & 0x80000000;
  }
  return j_local._4_4_;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bit(stbi__jpeg *j)
{
   unsigned int k;
   if (j->code_bits < 1) stbi__grow_buffer_unsafe(j);
   if (j->code_bits < 1) return 0; // ran out of bits from stream, return 0s intead of continuing
   k = j->code_buffer;
   j->code_buffer <<= 1;
   --j->code_bits;
   return k & 0x80000000;
}